

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  ImGuiLastItemData *pIVar1;
  float *pfVar2;
  ImRect *pIVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindowStackData *pIVar6;
  ImVec2 IVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ImGuiID IVar12;
  ImGuiItemFlags IVar13;
  ImGuiContext *pIVar14;
  ImGuiItemStatusFlags IVar15;
  float fVar16;
  long lVar17;
  uint uVar18;
  char *__function;
  ImGuiWindow *pIVar19;
  
  pIVar14 = GImGui;
  pIVar19 = GImGui->CurrentWindow;
  iVar4 = (GImGui->CurrentWindowStack).Size;
  if ((iVar4 < 2) && (GImGui->WithinFrameScopeWithImplicitWindow == true)) {
    __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1c0b,"void ImGui::End()");
  }
  if (iVar4 < 1) {
    __assert_fail("g.CurrentWindowStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1c0e,"void ImGui::End()");
  }
  if ((((pIVar19->Flags & 0x21000000U) == 0x1000000) && ((pIVar19->field_0x3f9 & 1) == 0)) &&
     (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1c12,"void ImGui::End()");
  }
  if ((pIVar19->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  if ((pIVar19->Flags & 0x20000000) == 0) {
    PopClipRect();
  }
  if ((pIVar19->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  if (((pIVar19->DockNode != (ImGuiDockNode *)0x0) && ((pIVar19->field_0x3f9 & 4) != 0)) &&
     (pIVar5 = pIVar19->DockNode->HostWindow, pIVar5 != (ImGuiWindow *)0x0)) {
    IVar7.y = ((pIVar19->DC).CursorMaxPos.y + (pIVar19->WindowPadding).y) -
              (pIVar5->WindowPadding).y;
    IVar7.x = ((pIVar19->DC).CursorMaxPos.x + (pIVar19->WindowPadding).x) -
              (pIVar5->WindowPadding).x;
    (pIVar5->DC).CursorMaxPos = IVar7;
  }
  lVar17 = (long)(pIVar14->CurrentWindowStack).Size;
  if (0 < lVar17) {
    pIVar6 = (pIVar14->CurrentWindowStack).Data;
    pIVar1 = &pIVar6[lVar17 + -1].ParentLastItemDataBackup;
    IVar12 = pIVar1->ID;
    IVar13 = pIVar1->InFlags;
    IVar15 = pIVar1->StatusFlags;
    fVar16 = (pIVar1->Rect).Min.x;
    pfVar2 = &pIVar6[lVar17 + -1].ParentLastItemDataBackup.Rect.Min.y;
    uVar8 = *(undefined8 *)pfVar2;
    uVar9 = *(undefined8 *)(pfVar2 + 2);
    pfVar2 = &pIVar6[lVar17 + -1].ParentLastItemDataBackup.NavRect.Min.y;
    uVar10 = *(undefined8 *)pfVar2;
    uVar11 = *(undefined8 *)(pfVar2 + 2);
    pIVar3 = &pIVar6[lVar17 + -1].ParentLastItemDataBackup.DisplayRect;
    IVar7 = pIVar3->Max;
    (pIVar14->LastItemData).DisplayRect.Min = pIVar3->Min;
    (pIVar14->LastItemData).DisplayRect.Max = IVar7;
    *(undefined8 *)&(pIVar14->LastItemData).NavRect.Min.y = uVar10;
    *(undefined8 *)&(pIVar14->LastItemData).NavRect.Max.y = uVar11;
    *(undefined8 *)&(pIVar14->LastItemData).Rect.Min.y = uVar8;
    *(undefined8 *)&(pIVar14->LastItemData).Rect.Max.y = uVar9;
    (pIVar14->LastItemData).ID = IVar12;
    (pIVar14->LastItemData).InFlags = IVar13;
    (pIVar14->LastItemData).StatusFlags = IVar15;
    (pIVar14->LastItemData).Rect.Min.x = fVar16;
    uVar18 = pIVar19->Flags;
    if ((uVar18 >> 0x1c & 1) != 0) {
      pIVar14->BeginMenuCount = pIVar14->BeginMenuCount + -1;
    }
    if ((uVar18 >> 0x1a & 1) != 0) {
      iVar4 = (pIVar14->BeginPopupStack).Size;
      if (iVar4 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_0015f120;
      }
      (pIVar14->BeginPopupStack).Size = iVar4 + -1;
    }
    ImGuiStackSizes::CompareWithCurrentState
              (&(pIVar14->CurrentWindowStack).Data[lVar17 + -1].StackSizesOnBegin);
    iVar4 = (pIVar14->CurrentWindowStack).Size;
    if (iVar4 < 1) {
      __function = "void ImVector<ImGuiWindowStackData>::pop_back() [T = ImGuiWindowStackData]";
LAB_0015f120:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                    ,0x764,__function);
    }
    uVar18 = iVar4 - 1;
    (pIVar14->CurrentWindowStack).Size = uVar18;
    if (uVar18 == 0) {
      pIVar19 = (ImGuiWindow *)0x0;
    }
    else {
      if (iVar4 == 1) goto LAB_0015f097;
      pIVar19 = (pIVar14->CurrentWindowStack).Data[(ulong)uVar18 - 1].Window;
    }
    SetCurrentWindow(pIVar19);
    if (pIVar14->CurrentWindow != (ImGuiWindow *)0x0) {
      SetCurrentViewport(pIVar19,pIVar14->CurrentWindow->Viewport);
      return;
    }
    return;
  }
LAB_0015f097:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x758,"T &ImVector<ImGuiWindowStackData>::back() [T = ImGuiWindowStackData]");
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) && !(window->Flags & ImGuiWindowFlags_DockNodeHost) && !window->DockIsActive)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    if (!(window->Flags & ImGuiWindowFlags_DockNodeHost))   // Pop inner window clip rectangle
        PopClipRect();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Docking: report contents sizes to parent to allow for auto-resize
    if (window->DockNode && window->DockTabIsVisible)
        if (ImGuiWindow* host_window = window->DockNode->HostWindow)         // FIXME-DOCK
            host_window->DC.CursorMaxPos = window->DC.CursorMaxPos + window->WindowPadding - host_window->WindowPadding;

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        g.BeginMenuCount--;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
    if (g.CurrentWindow)
        SetCurrentViewport(g.CurrentWindow, g.CurrentWindow->Viewport);
}